

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

double fasttext::getArgGauss<double>
                 (double val,minstd_rand *rng,double startSigma,double endSigma,double t,bool linear
                 )

{
  undefined7 in_register_00000031;
  result_type_conflict __x;
  double dVar1;
  normal_distribution<double> normal;
  normal_distribution<double> local_28;
  
  dVar1 = 0.0;
  if (0.0 <= t + -0.25) {
    dVar1 = t + -0.25;
  }
  if (0.5 <= dVar1) {
    dVar1 = 0.5;
  }
  local_28._M_param._M_stddev = (startSigma - endSigma) * -2.0 * dVar1 + startSigma;
  local_28._M_param._M_mean = 0.0;
  local_28._M_saved = 0.0;
  local_28._M_saved_available = false;
  __x = std::normal_distribution<double>::operator()(&local_28,rng);
  if ((int)CONCAT71(in_register_00000031,linear) == 0) {
    dVar1 = exp2(__x);
    dVar1 = dVar1 * val;
  }
  else {
    dVar1 = __x + val;
  }
  return dVar1;
}

Assistant:

T getArgGauss(
    T val,
    std::minstd_rand& rng,
    double startSigma,
    double endSigma,
    double t,
    bool linear) {
  T returnValue;
  const double stddev = startSigma -
      ((startSigma - endSigma) / 0.5) *
          std::min(0.5, std::max((t - 0.25), 0.0));

  std::normal_distribution<double> normal(0.0, stddev);

  const double coeff = normal(rng);
  double updateCoeff = 0.0;

  if (linear) {
    updateCoeff = coeff;
    returnValue = static_cast<T>(updateCoeff + val);
  } else {
    updateCoeff = std::pow(2.0, coeff);
    returnValue = static_cast<T>(updateCoeff * val);
  }

  return returnValue;
}